

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_IDEF(TT_ExecContext exc,FT_Long *args)

{
  FT_Byte FVar1;
  FT_Bool FVar2;
  TT_DefArray pTVar3;
  TT_DefRecord *limit;
  TT_DefRecord *def;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  if (exc->curRange == 3) {
    exc->error = 0x9c;
  }
  else {
    limit = exc->IDefs;
    pTVar3 = limit + exc->numIDefs;
    for (; (limit < pTVar3 && ((ulong)limit->opc != *args)); limit = limit + 1) {
    }
    if (limit == pTVar3) {
      if (exc->maxIDefs <= exc->numIDefs) {
        exc->error = 0x8d;
        return;
      }
      exc->numIDefs = exc->numIDefs + 1;
    }
    if ((*args < 0) || (0xff < *args)) {
      exc->error = 0x8d;
    }
    else {
      limit->opc = (uint)*args & 0xff;
      limit->start = exc->IP + 1;
      limit->range = exc->curRange;
      limit->active = '\x01';
      if ((ulong)exc->maxIns < (ulong)*args) {
        exc->maxIns = (uint)*args & 0xff;
      }
      do {
        FVar2 = SkipCode(exc);
        if (FVar2 != '\0') {
          return;
        }
        FVar1 = exc->opcode;
        if (FVar1 == ',') break;
        if (FVar1 == '-') {
          limit->end = exc->IP;
          return;
        }
      } while (FVar1 != 0x89);
      exc->error = 0x89;
    }
  }
  return;
}

Assistant:

static void
  Ins_IDEF( TT_ExecContext  exc,
            FT_Long*        args )
  {
    TT_DefRecord*  def;
    TT_DefRecord*  limit;


    /* we enable IDEF only in `prep' or `fpgm' */
    if ( exc->curRange == tt_coderange_glyph )
    {
      exc->error = FT_THROW( DEF_In_Glyf_Bytecode );
      return;
    }

    /*  First of all, look for the same function in our table */

    def   = exc->IDefs;
    limit = def + exc->numIDefs;

    for ( ; def < limit; def++ )
      if ( def->opc == (FT_ULong)args[0] )
        break;

    if ( def == limit )
    {
      /* check that there is enough room for a new instruction */
      if ( exc->numIDefs >= exc->maxIDefs )
      {
        exc->error = FT_THROW( Too_Many_Instruction_Defs );
        return;
      }
      exc->numIDefs++;
    }

    /* opcode must be unsigned 8-bit integer */
    if ( 0 > args[0] || args[0] > 0x00FF )
    {
      exc->error = FT_THROW( Too_Many_Instruction_Defs );
      return;
    }

    def->opc    = (FT_Byte)args[0];
    def->start  = exc->IP + 1;
    def->range  = exc->curRange;
    def->active = TRUE;

    if ( (FT_ULong)args[0] > exc->maxIns )
      exc->maxIns = (FT_Byte)args[0];

    /* Now skip the whole function definition. */
    /* We don't allow nested IDEFs & FDEFs.    */

    while ( SkipCode( exc ) == SUCCESS )
    {
      switch ( exc->opcode )
      {
      case 0x89:   /* IDEF */
      case 0x2C:   /* FDEF */
        exc->error = FT_THROW( Nested_DEFS );
        return;
      case 0x2D:   /* ENDF */
        def->end = exc->IP;
        return;
      }
    }
  }